

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhysicalDevice.cpp
# Opt level: O3

bool __thiscall
myvk::PhysicalDevice::GetExtensionSupport
          (PhysicalDevice *this,string *extension_name,uint32_t *p_version)

{
  const_iterator cVar1;
  _Rb_tree_header *p_Var2;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::find(&(this->m_extensions)._M_t,extension_name);
  p_Var2 = &(this->m_extensions)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar1._M_node != p_Var2 && p_version != (uint32_t *)0x0) {
    *p_version = cVar1._M_node[2]._M_color;
  }
  return (_Rb_tree_header *)cVar1._M_node != p_Var2;
}

Assistant:

bool PhysicalDevice::GetExtensionSupport(const std::string &extension_name, uint32_t *p_version) const {
	auto it = m_extensions.find(extension_name);
	if (p_version && it != m_extensions.end())
		*p_version = it->second;
	return it != m_extensions.end();
}